

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  ChunkHeader *pCVar1;
  bool bVar2;
  ulong uVar3;
  uint8_t *puVar4;
  size_t local_38;
  void *buffer;
  size_t size_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (this->shared_->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/allocators.h"
                  ,0x142,
                  "void *rapidjson::MemoryPoolAllocator<>::Malloc(size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (size == 0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  }
  else {
    uVar3 = size + 7 & 0xfffffffffffffff8;
    if (this->shared_->chunkHead->capacity < this->shared_->chunkHead->size + uVar3) {
      local_38 = uVar3;
      if (uVar3 < this->chunk_capacity_) {
        local_38 = this->chunk_capacity_;
      }
      bVar2 = AddChunk(this,local_38);
      if (!bVar2) {
        return (void *)0x0;
      }
    }
    puVar4 = GetChunkBuffer(this->shared_);
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 (puVar4 + this->shared_->chunkHead->size);
    pCVar1 = this->shared_->chunkHead;
    pCVar1->size = uVar3 + pCVar1->size;
  }
  return this_local;
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }